

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prox.cpp
# Opt level: O2

void lts2::ProxLinf(Mat *X,float radius)

{
  float fVar1;
  long lVar2;
  long *plVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  allocator local_29;
  string local_28 [32];
  
  lVar2 = *(long *)(X + 0x10);
  if ((lVar2 != 0) && ((*(uint *)X & 7) == 5)) {
    plVar3 = *(long **)(X + 0x48);
    iVar5 = ((*(uint *)X >> 3 & 0x1ff) + 1) * *(int *)(X + 0xc);
    uVar7 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    uVar6 = (ulong)*(uint *)(X + 8);
    if ((int)*(uint *)(X + 8) < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      lVar8 = *plVar3 * uVar7 + lVar2;
      for (lVar9 = 0; iVar5 != (int)lVar9; lVar9 = lVar9 + 1) {
        fVar1 = *(float *)(lVar8 + lVar9 * 4);
        if (radius < ABS(fVar1)) {
          uVar10 = -(uint)(0.0 < fVar1);
          *(uint *)(lVar8 + lVar9 * 4) = ~uVar10 & (uint)-radius | uVar10 & (uint)radius;
        }
      }
    }
    return;
  }
  std::__cxx11::string::string(local_28,"X.data && X.depth() == CV_32F",&local_29);
  uVar4 = cv::error(-0xd7,local_28,"ProxLinf",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/prox.cpp"
                    ,0x31);
  std::__cxx11::string::~string(local_28);
  _Unwind_Resume(uVar4);
}

Assistant:

void lts2::ProxLinf(cv::Mat& X, float radius)
{
  CV_Assert(X.data && X.depth() == CV_32F);

#ifdef WITH_DISPATCH
  // Get a queue
  dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);

  // Parallel loop over the rows
  float* p_imageData = X.ptr<float>(0);

  dispatch_apply(X.rows, queue,
                 ^(size_t y) {
                   float *p_x = X.ptr<float>(y);
                   
                   for (int x = 0; x < X.channels()*X.cols; ++x, ++p_x) {
                     if (std::fabs(*p_x) > radius) {
                       if (*p_x > 0.0)
                         *p_x = radius;
                       else
                         *p_x = -radius;
                     }
                   }
                 });    
#else
  for (int y = 0; y < X.rows; ++y)
  {
    float* p_x = X.ptr<float>(y);
    
    for (int x = 0; x < X.cols*X.channels(); ++x, ++p_x)
    {
      float abs_x = std::fabs(*p_x);
      if (abs_x > radius) {
        if (*p_x > 0.0) 
          *p_x = radius;
        else
        *p_x = -radius;
      }
    }
  }
#endif
}